

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getters-setters.c
# Opt level: O1

int run_test_getters_setters(void)

{
  int iVar1;
  uv_handle_type uVar2;
  uv_fs_type uVar3;
  int extraout_EAX;
  size_t sVar4;
  uv_loop_t *puVar5;
  int *piVar6;
  uv_loop_t *puVar7;
  uv_fs_t *req;
  ssize_t sVar8;
  uv_stat_t *puVar9;
  uv_stat_t *puVar10;
  char *__s1;
  uv_loop_t *unaff_RBX;
  uv_pipe_t *unaff_R14;
  uv_os_fd_t uStack_4ec;
  sockaddr_in sStack_4e8;
  undefined1 auStack_4d8 [120];
  undefined1 auStack_460 [216];
  undefined1 auStack_388 [312];
  undefined1 auStack_250 [248];
  undefined1 auStack_158 [272];
  uv_pipe_t *puStack_48;
  uv_timeval64_t uStack_38;
  
  uStack_38._8_8_ = 0x159eb5;
  sVar4 = uv_loop_size();
  uStack_38._8_8_ = 0x159ebd;
  puVar5 = (uv_loop_t *)malloc(sVar4);
  if (puVar5 == (uv_loop_t *)0x0) {
    uStack_38._8_8_ = 0x15a0bd;
    run_test_getters_setters_cold_19();
LAB_0015a0bd:
    uStack_38._8_8_ = 0x15a0c2;
    run_test_getters_setters_cold_1();
LAB_0015a0c2:
    uStack_38._8_8_ = 0x15a0c7;
    run_test_getters_setters_cold_2();
LAB_0015a0c7:
    uStack_38._8_8_ = 0x15a0cc;
    run_test_getters_setters_cold_3();
LAB_0015a0cc:
    uStack_38._8_8_ = 0x15a0d1;
    run_test_getters_setters_cold_4();
LAB_0015a0d1:
    uStack_38._8_8_ = 0x15a0d6;
    run_test_getters_setters_cold_5();
LAB_0015a0d6:
    uStack_38._8_8_ = 0x15a0db;
    run_test_getters_setters_cold_6();
LAB_0015a0db:
    uStack_38._8_8_ = 0x15a0e0;
    run_test_getters_setters_cold_7();
LAB_0015a0e0:
    uStack_38._8_8_ = 0x15a0e5;
    run_test_getters_setters_cold_8();
LAB_0015a0e5:
    uStack_38._8_8_ = 0x15a0ea;
    run_test_getters_setters_cold_9();
LAB_0015a0ea:
    uStack_38._8_8_ = 0x15a0ef;
    run_test_getters_setters_cold_10();
LAB_0015a0ef:
    uStack_38._8_8_ = 0x15a0f4;
    run_test_getters_setters_cold_11();
LAB_0015a0f4:
    uStack_38._8_8_ = 0x15a0f9;
    run_test_getters_setters_cold_12();
LAB_0015a0f9:
    uStack_38._8_8_ = 0x15a0fe;
    run_test_getters_setters_cold_13();
LAB_0015a0fe:
    uStack_38._8_8_ = 0x15a103;
    run_test_getters_setters_cold_14();
LAB_0015a103:
    uStack_38._8_8_ = 0x15a108;
    run_test_getters_setters_cold_15();
LAB_0015a108:
    uStack_38._8_8_ = 0x15a10d;
    run_test_getters_setters_cold_18();
LAB_0015a10d:
    uStack_38._8_8_ = 0x15a112;
    run_test_getters_setters_cold_16();
  }
  else {
    uStack_38._8_8_ = 0x159ed1;
    iVar1 = uv_loop_init(puVar5);
    unaff_RBX = puVar5;
    if (iVar1 != 0) goto LAB_0015a0bd;
    uStack_38._8_8_ = 0x159eeb;
    uv_loop_set_data(puVar5,&cookie1);
    if ((int *)puVar5->data != &cookie1) goto LAB_0015a0c2;
    uStack_38._8_8_ = 0x159efc;
    piVar6 = (int *)uv_loop_get_data(puVar5);
    if (piVar6 != &cookie1) goto LAB_0015a0c7;
    uStack_38._8_8_ = 0x159f0f;
    sVar4 = uv_handle_size(UV_NAMED_PIPE);
    uStack_38._8_8_ = 0x159f17;
    unaff_R14 = (uv_pipe_t *)malloc(sVar4);
    uStack_38._8_8_ = 0x159f27;
    uv_pipe_init(puVar5,unaff_R14,0);
    uStack_38._8_8_ = 0x159f2f;
    uVar2 = uv_handle_get_type((uv_handle_t *)unaff_R14);
    if (uVar2 != UV_NAMED_PIPE) goto LAB_0015a0cc;
    uStack_38._8_8_ = 0x159f40;
    puVar7 = uv_handle_get_loop((uv_handle_t *)unaff_R14);
    if (puVar7 != puVar5) goto LAB_0015a0d1;
    unaff_R14->data = &cookie2;
    uStack_38._8_8_ = 0x159f5b;
    piVar6 = (int *)uv_handle_get_data((uv_handle_t *)unaff_R14);
    if (piVar6 != &cookie2) goto LAB_0015a0d6;
    uStack_38._8_8_ = 0x159f6f;
    uv_handle_set_data((uv_handle_t *)unaff_R14,&cookie1);
    uStack_38._8_8_ = 0x159f77;
    piVar6 = (int *)uv_handle_get_data((uv_handle_t *)unaff_R14);
    if (piVar6 != &cookie1) goto LAB_0015a0db;
    if ((int *)unaff_R14->data != &cookie1) goto LAB_0015a0e0;
    uStack_38._8_8_ = 0x159f91;
    sVar4 = uv_stream_get_write_queue_size((uv_stream_t *)unaff_R14);
    if (sVar4 != 0) goto LAB_0015a0e5;
    unaff_R14->write_queue_size = unaff_R14->write_queue_size + 1;
    uStack_38._8_8_ = 0x159fa6;
    sVar4 = uv_stream_get_write_queue_size((uv_stream_t *)unaff_R14);
    if (sVar4 != 1) goto LAB_0015a0ea;
    unaff_R14->write_queue_size = unaff_R14->write_queue_size - 1;
    uStack_38._8_8_ = 0x159fbe;
    uv_close((uv_handle_t *)unaff_R14,(uv_close_cb)0x0);
    uStack_38._8_8_ = 0x159fc8;
    iVar1 = uv_run(puVar5,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0015a0ef;
    uStack_38._8_8_ = 0x159fda;
    sVar4 = uv_req_size(UV_FS);
    uStack_38._8_8_ = 0x159fe2;
    req = (uv_fs_t *)malloc(sVar4);
    uStack_38._8_8_ = 0x159ff9;
    uv_fs_stat(puVar5,req,".",(uv_fs_cb)0x0);
    uStack_38._8_8_ = 0x15a003;
    iVar1 = uv_run(puVar5,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0015a0f4;
    uStack_38._8_8_ = 0x15a013;
    uVar3 = uv_fs_get_type(req);
    if (uVar3 != UV_FS_STAT) goto LAB_0015a0f9;
    uStack_38._8_8_ = 0x15a024;
    sVar8 = uv_fs_get_result(req);
    if (sVar8 != 0) goto LAB_0015a0fe;
    uStack_38._8_8_ = 0x15a035;
    puVar9 = (uv_stat_t *)uv_fs_get_ptr(req);
    uStack_38._8_8_ = 0x15a040;
    puVar10 = uv_fs_get_statbuf(req);
    if (puVar9 != puVar10) goto LAB_0015a103;
    uStack_38._8_8_ = 0x15a051;
    puVar9 = uv_fs_get_statbuf(req);
    if ((puVar9->st_mode & 0x4000) == 0) goto LAB_0015a108;
    uStack_38._8_8_ = 0x15a063;
    __s1 = uv_fs_get_path(req);
    uStack_38._8_8_ = 0x15a072;
    iVar1 = strcmp(__s1,".");
    if (iVar1 != 0) goto LAB_0015a10d;
    uStack_38._8_8_ = 0x15a082;
    uv_fs_req_cleanup(req);
    uStack_38._8_8_ = 0x15a08a;
    iVar1 = uv_loop_close(puVar5);
    if (iVar1 == 0) {
      uStack_38._8_8_ = 0x15a09a;
      free(unaff_R14);
      uStack_38._8_8_ = 0x15a0a2;
      free(req);
      uStack_38._8_8_ = 0x15a0aa;
      free(puVar5);
      return 0;
    }
  }
  uStack_38._8_8_ = 0x15a117;
  run_test_getters_setters_cold_17();
  uStack_38.tv_sec = 0;
  puStack_48 = (uv_pipe_t *)0x15a12d;
  iVar1 = uv_gettimeofday(&uStack_38);
  if (iVar1 == 0) {
    if ((void *)uStack_38.tv_sec == (void *)0x0) goto LAB_0015a151;
    puStack_48 = (uv_pipe_t *)0x15a140;
    iVar1 = uv_gettimeofday((uv_timeval64_t *)0x0);
    if (iVar1 == -0x16) {
      return 0;
    }
  }
  else {
    puStack_48 = (uv_pipe_t *)0x15a151;
    run_test_gettimeofday_cold_1();
LAB_0015a151:
    puStack_48 = (uv_pipe_t *)0x15a156;
    run_test_gettimeofday_cold_3();
  }
  puStack_48 = (uv_pipe_t *)0x15a15b;
  run_test_gettimeofday_cold_2();
  auStack_158._264_8_ = unaff_RBX;
  puStack_48 = unaff_R14;
  puVar7 = uv_default_loop();
  puVar5 = (uv_loop_t *)0x1a4b5a;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_4e8);
  if (iVar1 == 0) {
    puVar5 = puVar7;
    iVar1 = uv_idle_init(puVar7,(uv_idle_t *)auStack_4d8);
    if (iVar1 != 0) goto LAB_0015a49d;
    puVar5 = (uv_loop_t *)auStack_4d8;
    iVar1 = uv_fileno((uv_handle_t *)puVar5,&uStack_4ec);
    if (iVar1 != -0x16) goto LAB_0015a4a2;
    uv_close((uv_handle_t *)auStack_4d8,(uv_close_cb)0x0);
    puVar5 = puVar7;
    iVar1 = uv_tcp_init(puVar7,(uv_tcp_t *)auStack_250);
    if (iVar1 != 0) goto LAB_0015a4a7;
    puVar5 = (uv_loop_t *)auStack_250;
    iVar1 = uv_fileno((uv_handle_t *)puVar5,&uStack_4ec);
    if (iVar1 != -9) goto LAB_0015a4ac;
    puVar5 = (uv_loop_t *)auStack_250;
    iVar1 = uv_tcp_bind((uv_tcp_t *)puVar5,(sockaddr *)&sStack_4e8,0);
    if (iVar1 != 0) goto LAB_0015a4b1;
    puVar5 = (uv_loop_t *)auStack_250;
    iVar1 = uv_fileno((uv_handle_t *)puVar5,&uStack_4ec);
    if (iVar1 != 0) goto LAB_0015a4b6;
    puVar5 = (uv_loop_t *)auStack_250;
    uv_close((uv_handle_t *)puVar5,(uv_close_cb)0x0);
    iVar1 = uv_fileno((uv_handle_t *)puVar5,&uStack_4ec);
    if (iVar1 != -9) goto LAB_0015a4bb;
    puVar5 = puVar7;
    iVar1 = uv_udp_init(puVar7,(uv_udp_t *)auStack_460);
    if (iVar1 != 0) goto LAB_0015a4c0;
    puVar5 = (uv_loop_t *)auStack_460;
    iVar1 = uv_fileno((uv_handle_t *)puVar5,&uStack_4ec);
    if (iVar1 != -9) goto LAB_0015a4c5;
    puVar5 = (uv_loop_t *)auStack_460;
    iVar1 = uv_udp_bind((uv_udp_t *)puVar5,(sockaddr *)&sStack_4e8,0);
    if (iVar1 != 0) goto LAB_0015a4ca;
    puVar5 = (uv_loop_t *)auStack_460;
    iVar1 = uv_fileno((uv_handle_t *)puVar5,&uStack_4ec);
    if (iVar1 != 0) goto LAB_0015a4cf;
    puVar5 = (uv_loop_t *)auStack_460;
    uv_close((uv_handle_t *)puVar5,(uv_close_cb)0x0);
    iVar1 = uv_fileno((uv_handle_t *)puVar5,&uStack_4ec);
    if (iVar1 != -9) goto LAB_0015a4d4;
    puVar5 = puVar7;
    iVar1 = uv_pipe_init(puVar7,(uv_pipe_t *)auStack_158,0);
    if (iVar1 != 0) goto LAB_0015a4d9;
    puVar5 = (uv_loop_t *)auStack_158;
    iVar1 = uv_fileno((uv_handle_t *)puVar5,&uStack_4ec);
    if (iVar1 != -9) goto LAB_0015a4de;
    puVar5 = (uv_loop_t *)auStack_158;
    iVar1 = uv_pipe_bind((uv_pipe_t *)puVar5,"/tmp/uv-test-sock");
    if (iVar1 != 0) goto LAB_0015a4e3;
    puVar5 = (uv_loop_t *)auStack_158;
    iVar1 = uv_fileno((uv_handle_t *)puVar5,&uStack_4ec);
    if (iVar1 != 0) goto LAB_0015a4e8;
    puVar5 = (uv_loop_t *)auStack_158;
    uv_close((uv_handle_t *)puVar5,(uv_close_cb)0x0);
    iVar1 = uv_fileno((uv_handle_t *)puVar5,&uStack_4ec);
    if (iVar1 != -9) goto LAB_0015a4ed;
    iVar1 = open64("/dev/tty",0,0);
    if (iVar1 < 0) {
      run_test_handle_fileno_cold_26();
LAB_0015a446:
      uv_run(puVar7,UV_RUN_DEFAULT);
      puVar5 = uv_default_loop();
      uv_walk(puVar5,close_walk_cb,(void *)0x0);
      uv_run(puVar5,UV_RUN_DEFAULT);
      puVar5 = uv_default_loop();
      iVar1 = uv_loop_close(puVar5);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0015a4f2;
    }
    puVar5 = puVar7;
    iVar1 = uv_tty_init(puVar7,(uv_tty_t *)auStack_388,iVar1,0);
    if (iVar1 != 0) goto LAB_0015a4f7;
    puVar5 = (uv_loop_t *)auStack_388;
    iVar1 = uv_is_readable((uv_stream_t *)puVar5);
    if (iVar1 == 0) goto LAB_0015a4fc;
    puVar5 = (uv_loop_t *)auStack_388;
    iVar1 = uv_is_writable((uv_stream_t *)puVar5);
    if (iVar1 != 0) goto LAB_0015a501;
    puVar5 = (uv_loop_t *)auStack_388;
    iVar1 = uv_fileno((uv_handle_t *)puVar5,&uStack_4ec);
    if (iVar1 != 0) goto LAB_0015a506;
    puVar5 = (uv_loop_t *)auStack_388;
    uv_close((uv_handle_t *)puVar5,(uv_close_cb)0x0);
    iVar1 = uv_fileno((uv_handle_t *)puVar5,&uStack_4ec);
    if (iVar1 != -9) goto LAB_0015a50b;
    puVar5 = (uv_loop_t *)auStack_388;
    iVar1 = uv_is_readable((uv_stream_t *)puVar5);
    if (iVar1 == 0) {
      puVar5 = (uv_loop_t *)auStack_388;
      iVar1 = uv_is_writable((uv_stream_t *)puVar5);
      if (iVar1 != 0) goto LAB_0015a515;
      goto LAB_0015a446;
    }
  }
  else {
    run_test_handle_fileno_cold_1();
LAB_0015a49d:
    run_test_handle_fileno_cold_2();
LAB_0015a4a2:
    run_test_handle_fileno_cold_3();
LAB_0015a4a7:
    run_test_handle_fileno_cold_4();
LAB_0015a4ac:
    run_test_handle_fileno_cold_5();
LAB_0015a4b1:
    run_test_handle_fileno_cold_6();
LAB_0015a4b6:
    run_test_handle_fileno_cold_7();
LAB_0015a4bb:
    run_test_handle_fileno_cold_8();
LAB_0015a4c0:
    run_test_handle_fileno_cold_9();
LAB_0015a4c5:
    run_test_handle_fileno_cold_10();
LAB_0015a4ca:
    run_test_handle_fileno_cold_11();
LAB_0015a4cf:
    run_test_handle_fileno_cold_12();
LAB_0015a4d4:
    run_test_handle_fileno_cold_13();
LAB_0015a4d9:
    run_test_handle_fileno_cold_14();
LAB_0015a4de:
    run_test_handle_fileno_cold_15();
LAB_0015a4e3:
    run_test_handle_fileno_cold_16();
LAB_0015a4e8:
    run_test_handle_fileno_cold_17();
LAB_0015a4ed:
    run_test_handle_fileno_cold_18();
LAB_0015a4f2:
    run_test_handle_fileno_cold_27();
LAB_0015a4f7:
    run_test_handle_fileno_cold_19();
LAB_0015a4fc:
    run_test_handle_fileno_cold_25();
LAB_0015a501:
    run_test_handle_fileno_cold_20();
LAB_0015a506:
    run_test_handle_fileno_cold_21();
LAB_0015a50b:
    run_test_handle_fileno_cold_22();
  }
  run_test_handle_fileno_cold_23();
LAB_0015a515:
  run_test_handle_fileno_cold_24();
  iVar1 = uv_is_closing((uv_handle_t *)puVar5);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)puVar5,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(getters_setters) {
  uv_loop_t* loop;
  uv_pipe_t* pipe;
  uv_fs_t* fs;
  int r;

  loop = malloc(uv_loop_size());
  ASSERT(loop != NULL);
  r = uv_loop_init(loop);
  ASSERT(r == 0);

  uv_loop_set_data(loop, &cookie1);
  ASSERT(loop->data == &cookie1);
  ASSERT(uv_loop_get_data(loop) == &cookie1);

  pipe = malloc(uv_handle_size(UV_NAMED_PIPE));
  r = uv_pipe_init(loop, pipe, 0);
  ASSERT(uv_handle_get_type((uv_handle_t*)pipe) == UV_NAMED_PIPE);

  ASSERT(uv_handle_get_loop((uv_handle_t*)pipe) == loop);
  pipe->data = &cookie2;
  ASSERT(uv_handle_get_data((uv_handle_t*)pipe) == &cookie2);
  uv_handle_set_data((uv_handle_t*)pipe, &cookie1);
  ASSERT(uv_handle_get_data((uv_handle_t*)pipe) == &cookie1);
  ASSERT(pipe->data == &cookie1);

  ASSERT(uv_stream_get_write_queue_size((uv_stream_t*)pipe) == 0);
  pipe->write_queue_size++;
  ASSERT(uv_stream_get_write_queue_size((uv_stream_t*)pipe) == 1);
  pipe->write_queue_size--;
  uv_close((uv_handle_t*)pipe, NULL);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  fs = malloc(uv_req_size(UV_FS));
  uv_fs_stat(loop, fs, ".", NULL);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(uv_fs_get_type(fs) == UV_FS_STAT);
  ASSERT(uv_fs_get_result(fs) == 0);
  ASSERT(uv_fs_get_ptr(fs) == uv_fs_get_statbuf(fs));
  ASSERT(uv_fs_get_statbuf(fs)->st_mode & S_IFDIR);
  ASSERT(strcmp(uv_fs_get_path(fs), ".") == 0);
  uv_fs_req_cleanup(fs);

  r = uv_loop_close(loop);
  ASSERT(r == 0);

  free(pipe);
  free(fs);
  free(loop);
  return 0;
}